

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O0

void __thiscall yaml::Value::Value(Value *this,string *s)

{
  string *s_local;
  Value *this_local;
  
  this->type_ = String;
  std::__cxx11::string::string((string *)&this->string_,(string *)s);
  Mapping::Mapping(&this->mapping_);
  std::vector<yaml::Value,_std::allocator<yaml::Value>_>::vector(&this->sequence_);
  return;
}

Assistant:

Value(std::string &&s) : type_(Type::String), string_(std::move(s)) {}